

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O3

Promise<void> __thiscall
kj::anon_unknown_0::PartialResponseService::request
          (PartialResponseService *this,HttpMethod method,StringPtr url,HttpHeaders *headers,
          AsyncInputStream *requestBody,Response *response)

{
  PromiseNode *pPVar1;
  TransformPromiseNodeBase *this_00;
  ChainPromiseNode *pCVar2;
  ChainPromiseNode *extraout_RDX;
  ChainPromiseNode *extraout_RDX_00;
  undefined4 in_register_00000034;
  Own<kj::_::ChainPromiseNode> OVar3;
  Promise<void> PVar4;
  Disposer *in_stack_00000010;
  Own<kj::_::PromiseNode> local_48;
  Own<kj::_::PromiseNode> local_38;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  AsyncInputStream::readAllBytes((AsyncInputStream *)&local_48,(uint64_t)response);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x38);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,&local_48,
             _::
             TransformPromiseNode<kj::Promise<void>,_kj::Array<unsigned_char>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++:2380:15),_kj::_::PropagateException>
             ::anon_class_16_2_1e9c3a7c_for_func::operator());
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0043f858;
  this_00[1].super_PromiseNode._vptr_PromiseNode =
       (_func_int **)CONCAT44(in_register_00000034,method);
  this_00[1].dependency.disposer = in_stack_00000010;
  local_38.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::Array<unsigned_char>,kj::(anonymous_namespace)::PartialResponseService::request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::AsyncInputStream&,kj::HttpService::Response&)::{lambda(kj::Array<unsigned_char>&&)#1},kj::_::PropagateException>>
        ::instance;
  local_38.ptr = (PromiseNode *)this_00;
  OVar3 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_28,&local_38);
  pPVar1 = local_38.ptr;
  pCVar2 = OVar3.ptr;
  *(undefined4 *)&(this->super_HttpService)._vptr_HttpService = local_28;
  *(undefined4 *)((long)&(this->super_HttpService)._vptr_HttpService + 4) = uStack_24;
  *(undefined4 *)&(this->exception).ptr = uStack_20;
  *(undefined4 *)&(this->exception).ptr.field_0x4 = uStack_1c;
  if ((TransformPromiseNodeBase *)local_38.ptr != (TransformPromiseNodeBase *)0x0) {
    local_38.ptr = (PromiseNode *)0x0;
    (**(local_38.disposer)->_vptr_Disposer)
              (local_38.disposer,
               ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode);
    pCVar2 = extraout_RDX;
  }
  pPVar1 = local_48.ptr;
  if (local_48.ptr != (PromiseNode *)0x0) {
    local_48.ptr = (PromiseNode *)0x0;
    (**(local_48.disposer)->_vptr_Disposer)
              (local_48.disposer,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
    pCVar2 = extraout_RDX_00;
  }
  PVar4.super_PromiseBase.node.ptr = &pCVar2->super_PromiseNode;
  PVar4.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar4.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> request(
      HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
      kj::AsyncInputStream& requestBody, Response& response) override {
    return requestBody.readAllBytes()
        .then([this,&response](kj::Array<byte>&&) -> kj::Promise<void> {
      HttpHeaders headers(table);
      auto body = response.send(200, "OK", headers, 32);
      auto promise = body->write("foo", 3);
      return promise.attach(kj::mv(body)).then([]() -> kj::Promise<void> {
        return KJ_EXCEPTION(FAILED, "failed");
      });
    });
  }